

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

bool __thiscall
cmCMakePresetsGraphInternal::MatchesCondition::Evaluate
          (MatchesCondition *this,
          vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
          *expanders,int version,optional<bool> *out)

{
  ExpandMacroResult EVar1;
  bool local_153;
  _Optional_payload_base<bool> local_152;
  undefined1 local_150 [8];
  RegularExpression regex;
  string regexStr;
  undefined1 local_50 [8];
  string str;
  optional<bool> *out_local;
  int version_local;
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  *expanders_local;
  MatchesCondition *this_local;
  
  str.field_2._8_8_ = out;
  std::__cxx11::string::string((string *)local_50,(string *)&this->String);
  EVar1 = anon_unknown.dwarf_3dd27a::ExpandMacros((string *)local_50,expanders,version);
  if (EVar1 != Ok) {
    if (EVar1 == Ignore) {
      std::optional<bool>::reset((optional<bool> *)str.field_2._8_8_);
      this_local._7_1_ = true;
      goto LAB_002e1b23;
    }
    if (EVar1 == Error) {
      this_local._7_1_ = false;
      goto LAB_002e1b23;
    }
  }
  std::__cxx11::string::string((string *)&regex.progsize,(string *)&this->Regex);
  EVar1 = anon_unknown.dwarf_3dd27a::ExpandMacros((string *)&regex.progsize,expanders,version);
  if (EVar1 == Ok) {
LAB_002e1a56:
    cmsys::RegularExpression::RegularExpression((RegularExpression *)local_150);
    this_local._7_1_ =
         cmsys::RegularExpression::compile((RegularExpression *)local_150,(string *)&regex.progsize)
    ;
    if (this_local._7_1_) {
      local_153 = cmsys::RegularExpression::find((RegularExpression *)local_150,(string *)local_50);
      std::optional<bool>::optional<bool,_true>((optional<bool> *)&local_152,&local_153);
      *(_Optional_payload_base<bool> *)str.field_2._8_8_ = local_152;
    }
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_150);
  }
  else if (EVar1 == Ignore) {
    std::optional<bool>::reset((optional<bool> *)str.field_2._8_8_);
    this_local._7_1_ = true;
  }
  else {
    if (EVar1 != Error) goto LAB_002e1a56;
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)&regex.progsize);
LAB_002e1b23:
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool cmCMakePresetsGraphInternal::MatchesCondition::Evaluate(
  const std::vector<MacroExpander>& expanders, int version,
  cm::optional<bool>& out) const
{
  std::string str = this->String;
  CHECK_EXPAND(out, str, expanders, version);
  std::string regexStr = this->Regex;
  CHECK_EXPAND(out, regexStr, expanders, version);

  cmsys::RegularExpression regex;
  if (!regex.compile(regexStr)) {
    return false;
  }

  out = regex.find(str);
  return true;
}